

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O3

int bgzf_mt(BGZF *fp,int n_threads,int n_sub_blks)

{
  uint uVar1;
  ulong __nmemb;
  int iVar2;
  bgzf_mtaux_t *pbVar3;
  int *piVar4;
  void **ppvVar5;
  void *pvVar6;
  pthread_t *ppVar7;
  worker_t *pwVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  pthread_attr_t attr;
  pthread_attr_t local_68;
  
  uVar1 = *(uint *)fp;
  iVar2 = -1;
  if ((((uVar1 & 0x30000) != 0) && (__nmemb = (ulong)(uint)n_threads, 1 < n_threads)) &&
     (fp->mt == (bgzf_mtaux_t *)0x0)) {
    pbVar3 = (bgzf_mtaux_t *)calloc(1,0x90);
    pbVar3->n_threads = n_threads;
    uVar11 = n_sub_blks * n_threads;
    pbVar3->n_blks = uVar11;
    piVar4 = (int *)calloc((long)(int)uVar11,4);
    pbVar3->len = piVar4;
    ppvVar5 = (void **)calloc((long)(int)uVar11,8);
    pbVar3->blk = ppvVar5;
    if (0 < (int)uVar11) {
      uVar12 = 0;
      do {
        pvVar6 = malloc(0x10000);
        ppvVar5[uVar12] = pvVar6;
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
    ppVar7 = (pthread_t *)calloc(__nmemb,8);
    pbVar3->tid = ppVar7;
    pwVar8 = (worker_t *)calloc(__nmemb,0x20);
    pbVar3->w = pwVar8;
    uVar12 = 0;
    do {
      pwVar8->i = (int)uVar12;
      pwVar8->mt = pbVar3;
      pwVar8->compress_level = (int)(uVar1 << 3) >> 0x17;
      pvVar6 = malloc(0x10000);
      pwVar8->buf = pvVar6;
      uVar12 = uVar12 + 1;
      pwVar8 = pwVar8 + 1;
    } while (__nmemb != uVar12);
    pthread_attr_init(&local_68);
    pthread_attr_setdetachstate(&local_68,0);
    pthread_mutex_init((pthread_mutex_t *)&pbVar3->lock,(pthread_mutexattr_t *)0x0);
    pthread_cond_init((pthread_cond_t *)&pbVar3->cv,(pthread_condattr_t *)0x0);
    if (1 < pbVar3->n_threads) {
      lVar9 = 1;
      lVar10 = 0x20;
      lVar13 = 8;
      do {
        pthread_create((pthread_t *)((long)pbVar3->tid + lVar13),&local_68,mt_worker,
                       (void *)((long)&pbVar3->w->mt + lVar10));
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0x20;
        lVar13 = lVar13 + 8;
      } while (lVar9 < pbVar3->n_threads);
    }
    fp->mt = pbVar3;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int bgzf_mt(BGZF *fp, int n_threads, int n_sub_blks)
{
    int i;
    mtaux_t *mt;
    pthread_attr_t attr;
    if (!fp->is_write || fp->mt || n_threads <= 1) return -1;
    mt = (mtaux_t*)calloc(1, sizeof(mtaux_t));
    mt->n_threads = n_threads;
    mt->n_blks = n_threads * n_sub_blks;
    mt->len = (int*)calloc(mt->n_blks, sizeof(int));
    mt->blk = (void**)calloc(mt->n_blks, sizeof(void*));
    for (i = 0; i < mt->n_blks; ++i)
        mt->blk[i] = malloc(BGZF_MAX_BLOCK_SIZE);
    mt->tid = (pthread_t*)calloc(mt->n_threads, sizeof(pthread_t)); // tid[0] is not used, as the worker 0 is launched by the master
    mt->w = (worker_t*)calloc(mt->n_threads, sizeof(worker_t));
    for (i = 0; i < mt->n_threads; ++i) {
        mt->w[i].i = i;
        mt->w[i].mt = mt;
        mt->w[i].compress_level = fp->compress_level;
        mt->w[i].buf = malloc(BGZF_MAX_BLOCK_SIZE);
    }
    pthread_attr_init(&attr);
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);
    pthread_mutex_init(&mt->lock, 0);
    pthread_cond_init(&mt->cv, 0);
    for (i = 1; i < mt->n_threads; ++i) // worker 0 is effectively launched by the master thread
        pthread_create(&mt->tid[i], &attr, mt_worker, &mt->w[i]);
    fp->mt = mt;
    return 0;
}